

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

int uv__write_req_update(uv_stream_t *stream,uv_write_t *req,size_t n)

{
  uv_buf_t *local_38;
  size_t len;
  uv_buf_t *buf;
  size_t n_local;
  uv_write_t *req_local;
  uv_stream_t *stream_local;
  
  if (n <= stream->write_queue_size) {
    stream->write_queue_size = stream->write_queue_size - n;
    len = (size_t)(req->bufs + req->write_index);
    buf = (uv_buf_t *)n;
    do {
      if (buf < *(uv_buf_t **)(len + 8)) {
        local_38 = buf;
      }
      else {
        local_38 = *(uv_buf_t **)(len + 8);
      }
      *(long *)len = (long)&local_38->base + *(long *)len;
      *(long *)(len + 8) = *(long *)(len + 8) - (long)local_38;
      len = len + (long)(int)(uint)(*(long *)(len + 8) == 0) * 0x10;
      buf = (uv_buf_t *)((long)buf - (long)local_38);
    } while (buf != (uv_buf_t *)0x0);
    req->write_index = (uint)((long)(len - (long)req->bufs) >> 4);
    return (int)(req->write_index == req->nbufs);
  }
  __assert_fail("n <= stream->write_queue_size",
                "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/stream.c"
                ,0x2b6,"int uv__write_req_update(uv_stream_t *, uv_write_t *, size_t)");
}

Assistant:

static int uv__write_req_update(uv_stream_t* stream,
                                uv_write_t* req,
                                size_t n) {
  uv_buf_t* buf;
  size_t len;

  assert(n <= stream->write_queue_size);
  stream->write_queue_size -= n;

  buf = req->bufs + req->write_index;

  do {
    len = n < buf->len ? n : buf->len;
    buf->base += len;
    buf->len -= len;
    buf += (buf->len == 0);  /* Advance to next buffer if this one is empty. */
    n -= len;
  } while (n > 0);

  req->write_index = buf - req->bufs;

  return req->write_index == req->nbufs;
}